

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode bundle_create(Curl_easy *data,connectbundle **cb_ptr)

{
  connectbundle *pcVar1;
  connectbundle **cb_ptr_local;
  Curl_easy *data_local;
  
  pcVar1 = (connectbundle *)(*Curl_cmalloc)(0x30);
  *cb_ptr = pcVar1;
  if (*cb_ptr == (connectbundle *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    (*cb_ptr)->num_connections = 0;
    (*cb_ptr)->multiuse = 0;
    Curl_llist_init(&(*cb_ptr)->conn_list,conn_llist_dtor);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode bundle_create(struct Curl_easy *data,
                              struct connectbundle **cb_ptr)
{
  (void)data;
  DEBUGASSERT(*cb_ptr == NULL);
  *cb_ptr = malloc(sizeof(struct connectbundle));
  if(!*cb_ptr)
    return CURLE_OUT_OF_MEMORY;

  (*cb_ptr)->num_connections = 0;
  (*cb_ptr)->multiuse = BUNDLE_UNKNOWN;

  Curl_llist_init(&(*cb_ptr)->conn_list, (curl_llist_dtor) conn_llist_dtor);
  return CURLE_OK;
}